

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O1

void ReportBuildOptions(void)

{
  pointer ppcVar1;
  int iVar2;
  LogHelper *h;
  char **o;
  pointer t;
  initializer_list<const_char_*> __l;
  allocator_type local_31;
  char *local_30;
  char *local_28;
  
  if (ReportBuildOptions()::options == '\0') {
    iVar2 = __cxa_guard_acquire(&ReportBuildOptions()::options);
    if (iVar2 != 0) {
      local_30 = "zlib";
      local_28 = "lzma";
      __l._M_len = 2;
      __l._M_array = &local_30;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&ReportBuildOptions::options,__l,&local_31);
      __cxa_atexit(std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector,
                   &ReportBuildOptions::options,&__dso_handle);
      __cxa_guard_release(&ReportBuildOptions()::options);
    }
  }
  if (ReportBuildOptions::options.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      ReportBuildOptions::options.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    util::operator<<((LogHelper *)&util::cout,(char (*) [18])"\nBuild features:\n");
    ppcVar1 = ReportBuildOptions::options.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ReportBuildOptions::options.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        ReportBuildOptions::options.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      t = ReportBuildOptions::options.
          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start;
      do {
        local_30 = (char *)CONCAT71(local_30._1_7_,0x20);
        h = util::operator<<((LogHelper *)&util::cout,(char *)&local_30);
        util::operator<<(h,t);
        t = t + 1;
      } while (t != ppcVar1);
    }
    util::operator<<((LogHelper *)&util::cout,(char (*) [2])0x1ad42e);
  }
  return;
}

Assistant:

void ReportBuildOptions()
{
    static const std::vector<const char*> options{
#ifdef HAVE_ZLIB
        "zlib",
#endif
#ifdef HAVE_BZIP2
        "bzip2",
#endif
#ifdef HAVE_LZMA
        "lzma",
#endif
#ifdef HAVE_WINUSB
        "WinUSB",
#endif
#ifdef HAVE_LIBUSB1
        "libusb1",
#endif
#ifdef HAVE_FTDI
        "FTDI",
#endif
#ifdef HAVE_FTD2XX
        "FTD2XX",
#endif
#ifdef HAVE_CAPSIMAGE
        "CAPSimage",
#endif
#ifdef HAVE_FDRAWCMD_H
        "fdrawcmd.sys",
#endif
    };

    if (options.size())
    {
        util::cout << "\nBuild features:\n";
        for (const auto& o : options)
            util::cout << ' ' << o;
        util::cout << "\n";
    }
}